

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O0

void __thiscall PSAC_Lcp1_Test::TestBody(PSAC_Lcp1_Test *this)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  char *pcVar3;
  comm *in_RCX;
  char *in_R9;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_180 [8];
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  sa;
  string local_str;
  undefined1 local_58 [8];
  string str;
  size_t size;
  comm c;
  PSAC_Lcp1_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)&size);
  str.field_2._8_8_ = 0x104cb;
  std::__cxx11::string::string((string *)local_58);
  iVar2 = mxx::comm::rank((comm *)&size);
  if (iVar2 == 0) {
    rand_dna_abi_cxx11_((string *)((long)&local_str.field_2 + 8),str.field_2._8_8_,0x17);
    std::__cxx11::string::operator=
              ((string *)local_58,(string *)(local_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(local_str.field_2._M_local_buf + 8));
  }
  mxx::stable_distribute<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(mxx *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,in_RCX);
  begin._M_current = (char *)std::__cxx11::string::begin();
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::__cxx11::string::end();
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                  *)local_180,begin,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )gtest_ar_.message_.ptr_,(comm *)&size);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
               *)local_180,true,0);
  bVar1 = check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                    ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                      *)local_180,(string *)local_58,(comm *)&size);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1a0,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1a0,
               (AssertionResult *)"check_sa_dss(sa, str, c)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  bVar1 = check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                    ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                      *)local_180,
                     (string *)
                     &sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(comm *)&size);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1e0,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1e0,
               (AssertionResult *)"check_lcp_eq(sa, local_str, c)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
               *)local_180,true,3);
  bVar1 = check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                    ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                      *)local_180,(string *)local_58,(comm *)&size);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_220,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_220,
               (AssertionResult *)"check_sa_dss(sa, str, c)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  bVar1 = check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                    ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                      *)local_180,
                     (string *)
                     &sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(comm *)&size);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_260,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_290,(internal *)local_260,(AssertionResult *)"check_lcp_eq(sa, local_str, c)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                   *)local_180);
  std::__cxx11::string::~string
            ((string *)
             &sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_58);
  mxx::comm::~comm((comm *)&size);
  return;
}

Assistant:

TEST(PSAC, Lcp1) {
    mxx::comm c;

    size_t size = 66763;

    std::string str;
    if (c.rank() == 0) {
        // generate some random input string
        str = rand_dna(size, 23);
    }
    // distribute string equally
    std::string local_str = mxx::stable_distribute(str, c);

    // create suffix array w/o LCP
    suffix_array<std::string::iterator, uint64_t, true> sa(local_str.begin(), local_str.end(), c);

    // construct suffix  and LCP array
    sa.construct();
    EXPECT_TRUE(check_sa_dss(sa, str, c));
    EXPECT_TRUE(check_lcp_eq(sa, local_str, c));
    // construct suffix and LCP array using artificial small `k` to force bucket chaising
    sa.construct(true, 3);
    EXPECT_TRUE(check_sa_dss(sa, str, c));
    EXPECT_TRUE(check_lcp_eq(sa, local_str, c));
}